

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_reader.c
# Opt level: O3

void rfc5444_reader_init(rfc5444_reader *context)

{
  avl_init(&context->packet_consumer,_consumer_avl_comp,true);
  avl_init(&context->message_consumer,_consumer_avl_comp,true);
  if (context->malloc_addrblock_entry == (_func_rfc5444_reader_addrblock_entry_ptr *)0x0) {
    context->malloc_addrblock_entry = _malloc_addrblock_entry;
  }
  if (context->malloc_tlvblock_entry == (_func_rfc5444_reader_tlvblock_entry_ptr *)0x0) {
    context->malloc_tlvblock_entry = _malloc_tlvblock_entry;
  }
  if (context->free_addrblock_entry == (_func_void_rfc5444_reader_addrblock_entry_ptr *)0x0) {
    context->free_addrblock_entry = _free_addrblock_entry;
  }
  if (context->free_tlvblock_entry == (_func_void_rfc5444_reader_tlvblock_entry_ptr *)0x0) {
    context->free_tlvblock_entry = _free_tlvblock_entry;
  }
  return;
}

Assistant:

void
rfc5444_reader_init(struct rfc5444_reader *context) {
  avl_init(&context->packet_consumer, _consumer_avl_comp, true);
  avl_init(&context->message_consumer, _consumer_avl_comp, true);

  if (context->malloc_addrblock_entry == NULL)
    context->malloc_addrblock_entry = _malloc_addrblock_entry;
  if (context->malloc_tlvblock_entry == NULL)
    context->malloc_tlvblock_entry = _malloc_tlvblock_entry;

  if (context->free_addrblock_entry == NULL)
    context->free_addrblock_entry = _free_addrblock_entry;
  if (context->free_tlvblock_entry == NULL)
    context->free_tlvblock_entry = _free_tlvblock_entry;
}